

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::HlslParseContext::convertInitializerList
          (HlslParseContext *this,TSourceLoc *loc,TType *type,TIntermTyped *initializer,
          TIntermTyped *scalarInit)

{
  long lVar1;
  TVector<glslang::TArraySize> *pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  TType *type_00;
  TString name;
  TString name_00;
  TString name_01;
  TString name_02;
  TString structName;
  TString structName_00;
  TString structName_01;
  TString structName_02;
  TArraySizes *this_00;
  char cVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermAggregate *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long *plVar9;
  long *plVar10;
  undefined4 extraout_var_05;
  TTypeList *pTVar11;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  long lVar12;
  TSmallArrayVector *this_01;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  TIntermTyped *pTVar13;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  char *pcVar14;
  ulong uVar15;
  int d;
  _func_int **pp_Var16;
  int iVar17;
  size_t i;
  undefined8 in_stack_fffffffffffffd38;
  HlslParseContext *pHVar18;
  TSourceLoc *pTVar19;
  pool_allocator<char> local_2a8;
  TType arrayType;
  TType elementType;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_170 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_148 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_120 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_f8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_d0 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_a8 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  
  iVar7 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[6])(initializer);
  node = (TIntermAggregate *)CONCAT44(extraout_var,iVar7);
  if ((node == (TIntermAggregate *)0x0) || ((node->super_TIntermOperator).op != EOpNull)) {
    iVar7 = (*type->_vptr_TType[0x18])(type);
    if ((char)iVar7 != '\0') {
      return initializer;
    }
    iVar7 = (*(initializer->super_TIntermNode)._vptr_TIntermNode[0x1e])(initializer);
    cVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0xc0))
                      ((long *)CONCAT44(extraout_var_00,iVar7));
    if (cVar5 == '\0') {
      return initializer;
    }
    node = TIntermediate::makeAggregate
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      &initializer->super_TIntermNode);
  }
  iVar7 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar7 == '\0') {
    iVar7 = (*type->_vptr_TType[0x25])(type);
    pTVar19 = loc;
    if ((char)iVar7 != '\0') {
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      lVar12 = *(long *)(CONCAT44(extraout_var_05,iVar7) + 0x10) -
               *(long *)(CONCAT44(extraout_var_05,iVar7) + 8);
      uVar15 = (lVar12 >> 3) - 1;
      lVar12 = lVar12 * 4;
      do {
        pTVar11 = TType::getStruct(type);
        uVar15 = uVar15 + 1;
        if ((ulong)((long)(pTVar11->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar11->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar15) {
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(node);
          pTVar11 = TType::getStruct(type);
          pHVar18 = this;
          lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_12,iVar7),
                       (int)((ulong)((long)(pTVar11->
                                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ).
                                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pTVar11->
                                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                          ).
                                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5),
                       scalarInit);
          pTVar11 = TType::getStruct(type);
          pTVar3 = (pTVar11->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pTVar4 = (pTVar11->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(node);
          if ((long)pTVar3 - (long)pTVar4 >> 5 ==
              *(long *)(CONCAT44(extraout_var_13,iVar7) + 0x10) -
              *(long *)(CONCAT44(extraout_var_13,iVar7) + 8) >> 3) {
            lVar12 = 0;
            uVar15 = 0;
            while (pTVar11 = TType::getStruct(type), this = pHVar18,
                  uVar15 < (ulong)((long)(pTVar11->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pTVar11->
                                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ).
                                         super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5)) {
              pTVar11 = TType::getStruct(type);
              type_00 = *(TType **)
                         ((long)&((pTVar11->
                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ).
                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->type + lVar12 * 4);
              iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(node);
              pTVar13 = (TIntermTyped *)
                        (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_14,iVar7) + 8) +
                                                lVar12) + 0x18))();
              pTVar13 = convertInitializerList(pHVar18,pTVar19,type_00,pTVar13,scalarInit);
              iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(node);
              *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_15,iVar7) + 8) + lVar12) = pTVar13;
              iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                        _vptr_TIntermNode[0x32])(node);
              uVar15 = uVar15 + 1;
              plVar9 = (long *)(*(long *)(CONCAT44(extraout_var_16,iVar7) + 8) + lVar12);
              lVar12 = lVar12 + 8;
              if (*plVar9 == 0) {
                return (TIntermTyped *)0x0;
              }
            }
            goto LAB_00325759;
          }
          pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar14 = "wrong number of structure members";
          goto LAB_003256ed;
        }
        pTVar11 = TType::getStruct(type);
        loc = pTVar19;
        cVar5 = (**(code **)(**(long **)((long)&((pTVar11->
                                                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ).
                                                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->type +
                                        lVar12) + 0x1b0))();
        lVar12 = lVar12 + 0x20;
        pTVar19 = loc;
      } while (cVar5 == '\0');
      pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar14 = "cannot implicitly initialize opaque members";
LAB_003256ed:
      arrayType._8_8_ = "";
      goto LAB_00325ae8;
    }
    iVar7 = (*type->_vptr_TType[0x1c])(type);
    if ((char)iVar7 == '\0') {
      iVar7 = (*type->_vptr_TType[0x1b])(type);
      if ((char)iVar7 == '\0') {
        iVar7 = (*type->_vptr_TType[0x18])(type);
        if ((char)iVar7 == '\0') {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_148,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_170,"",&local_2a8);
          name_01._M_dataplus._M_p = (pointer)local_170;
          name_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_148;
          name_01._M_string_length = in_stack_fffffffffffffd38;
          name_01.field_2._M_allocated_capacity = (size_type)this;
          name_01.field_2._8_8_ = pTVar19;
          structName_01._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName_01._M_string_length = (size_type)arrayType._vptr_TType;
          structName_01.field_2._M_allocated_capacity = arrayType._8_8_;
          structName_01.field_2._8_8_ = arrayType.qualifier.semanticName;
          TType::getCompleteString
                    ((TString *)&arrayType,type,false,true,true,true,name_01,structName_01);
          pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar14 = "unexpected initializer-list type:";
LAB_00325ae8:
          (*pp_Var16[0x2d])(this,loc,pcVar14,"initializer list",arrayType._8_8_);
          return (TIntermTyped *)0x0;
        }
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_19,iVar7),1,scalarInit);
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        if ((*(long *)(CONCAT44(extraout_var_20,iVar7) + 0x10) -
             *(long *)(CONCAT44(extraout_var_20,iVar7) + 8) & 0x7fffffff8U) != 8) {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_f8,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_120,"",&local_2a8);
          name_02._M_dataplus._M_p = (pointer)local_120;
          name_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_f8;
          name_02._M_string_length = in_stack_fffffffffffffd38;
          name_02.field_2._M_allocated_capacity = (size_type)this;
          name_02.field_2._8_8_ = pTVar19;
          structName_02._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName_02._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName_02._M_string_length = (size_type)arrayType._vptr_TType;
          structName_02.field_2._M_allocated_capacity = arrayType._8_8_;
          structName_02.field_2._8_8_ = arrayType.qualifier.semanticName;
          loc = pTVar19;
          TType::getCompleteString
                    ((TString *)&arrayType,type,false,true,true,true,name_02,structName_02);
          pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar14 = "scalar expected one element:";
          goto LAB_00325ae8;
        }
      }
      else {
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        iVar17 = (*type->_vptr_TType[0xc])(type);
        lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_17,iVar7),iVar17,scalarInit);
        iVar7 = (*type->_vptr_TType[0xc])(type);
        iVar17 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                   _vptr_TIntermNode[0x32])(node);
        if (iVar7 != (int)((ulong)(*(long *)(CONCAT44(extraout_var_18,iVar17) + 0x10) -
                                  *(long *)(CONCAT44(extraout_var_18,iVar17) + 8)) >> 3)) {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_a8,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_d0,"",&local_2a8);
          name._M_dataplus._M_p = (pointer)local_d0;
          name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_a8;
          name._M_string_length = in_stack_fffffffffffffd38;
          name.field_2._M_allocated_capacity = (size_type)this;
          name.field_2._8_8_ = pTVar19;
          structName._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName._M_string_length = (size_type)arrayType._vptr_TType;
          structName.field_2._M_allocated_capacity = arrayType._8_8_;
          structName.field_2._8_8_ = arrayType.qualifier.semanticName;
          loc = pTVar19;
          TType::getCompleteString((TString *)&arrayType,type,false,true,true,true,name,structName);
          pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar14 = "wrong vector size (or rows in a matrix column):";
          goto LAB_00325ae8;
        }
      }
    }
    else {
      iVar7 = TType::computeNumComponents(type);
      iVar17 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x32])(node);
      if (iVar7 != (int)((ulong)(*(long *)(CONCAT44(extraout_var_06,iVar17) + 0x10) -
                                *(long *)(CONCAT44(extraout_var_06,iVar17) + 8)) >> 3)) {
        iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node);
        loc = pTVar19;
        iVar17 = (*type->_vptr_TType[0xd])(type);
        pHVar18 = this;
        pTVar19 = loc;
        lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_07,iVar7),iVar17,scalarInit);
        iVar7 = (*type->_vptr_TType[0xd])(type);
        iVar17 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                   _vptr_TIntermNode[0x32])(node);
        if (iVar7 != (int)((ulong)(*(long *)(CONCAT44(extraout_var_08,iVar17) + 0x10) -
                                  *(long *)(CONCAT44(extraout_var_08,iVar17) + 8)) >> 3)) {
          elementType._vptr_TType = (_func_int **)GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>
                    (local_58,"",(pool_allocator<char> *)&elementType);
          local_2a8.allocator = GetThreadPoolAllocator();
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          basic_string<glslang::std::allocator<char>>(local_80,"",&local_2a8);
          name_00._M_dataplus._M_p = (pointer)local_80;
          name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_58;
          name_00._M_string_length = in_stack_fffffffffffffd38;
          name_00.field_2._M_allocated_capacity = (size_type)pHVar18;
          name_00.field_2._8_8_ = pTVar19;
          structName_00._M_dataplus._M_p = (pointer)local_2a8.allocator;
          structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)scalarInit;
          structName_00._M_string_length = (size_type)arrayType._vptr_TType;
          structName_00.field_2._M_allocated_capacity = arrayType._8_8_;
          structName_00.field_2._8_8_ = arrayType.qualifier.semanticName;
          TType::getCompleteString
                    ((TString *)&arrayType,type,false,true,true,true,name_00,structName_00);
          pp_Var16 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar14 = "wrong number of matrix columns:";
          goto LAB_00325ae8;
        }
        lVar12 = 0;
        TType::TType(&arrayType,type,0,false);
        while (iVar7 = (*type->_vptr_TType[0xd])(type), this = pHVar18, lVar12 < iVar7) {
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(node);
          pTVar13 = (TIntermTyped *)
                    (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_09,iVar7) + 8) +
                                            lVar12 * 8) + 0x18))();
          pTVar13 = convertInitializerList(pHVar18,loc,&arrayType,pTVar13,scalarInit);
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(node);
          *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_10,iVar7) + 8) + lVar12 * 8) = pTVar13;
          iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(node);
          lVar1 = lVar12 * 8;
          lVar12 = lVar12 + 1;
          if (*(long *)(*(long *)(CONCAT44(extraout_var_11,iVar7) + 8) + lVar1) == 0) {
            return (TIntermTyped *)0x0;
          }
        }
      }
    }
LAB_00325759:
    loc = pTVar19;
    iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    if (*(long *)(CONCAT44(extraout_var_21,iVar7) + 0x10) -
        *(long *)(CONCAT44(extraout_var_21,iVar7) + 8) == 8) {
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      node = (TIntermAggregate *)
             (**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_22,iVar7) + 8) + 0x18))()
      ;
    }
  }
  else {
    iVar17 = 1;
    TType::TType(&arrayType,EbtVoid,EvqTemporary,1,0,0,false);
    TType::shallowCopy(&arrayType,type);
    iVar7 = (*type->_vptr_TType[0x13])(type);
    TType::copyArraySizes(&arrayType,(TArraySizes *)CONCAT44(extraout_var_01,iVar7));
    iVar7 = (*type->_vptr_TType[0x1f])(type);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      TArraySizes::changeOuterSize
                (arrayType.arraySizes,
                 (int)((ulong)(*(long *)(CONCAT44(extraout_var_02,iVar7) + 0x10) -
                              *(long *)(CONCAT44(extraout_var_02,iVar7) + 8)) >> 3));
    }
    bVar6 = TType::isArrayOfArrays(&arrayType);
    if ((bVar6) &&
       (iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(node),
       *(long *)(CONCAT44(extraout_var_03,iVar7) + 0x10) !=
       *(long *)(CONCAT44(extraout_var_03,iVar7) + 8))) {
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      plVar9 = (long *)(**(code **)(*(long *)**(undefined8 **)(CONCAT44(extraout_var_04,iVar7) + 8)
                                   + 0x18))();
      plVar10 = (long *)(**(code **)(*plVar9 + 0xf0))();
      cVar5 = (**(code **)(*plVar10 + 0xe8))(plVar10);
      if (cVar5 != '\0') {
        pTVar2 = ((arrayType.arraySizes)->sizes).sizes;
        if (pTVar2 == (TVector<glslang::TArraySize> *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = (int)((ulong)((long)(pTVar2->
                                      super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ).
                                      super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar2->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
        }
        plVar10 = (long *)(**(code **)(*plVar9 + 0xf0))();
        lVar12 = (**(code **)(*plVar10 + 0x98))(plVar10);
        lVar12 = *(long *)(lVar12 + 8);
        if (lVar12 != 0) {
          iVar17 = (int)((ulong)(*(long *)(lVar12 + 0x10) - *(long *)(lVar12 + 8)) >> 4) + 1;
        }
        if (iVar7 == iVar17) {
          iVar7 = 1;
          while( true ) {
            pTVar2 = ((arrayType.arraySizes)->sizes).sizes;
            if (pTVar2 == (TVector<glslang::TArraySize> *)0x0) {
              iVar17 = 0;
            }
            else {
              iVar17 = (int)((ulong)((long)(pTVar2->
                                           super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                           ).
                                           super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pTVar2->
                                          super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                          ).
                                          super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
            }
            if (iVar17 <= iVar7) break;
            uVar8 = TSmallArrayVector::getDimSize(&(arrayType.arraySizes)->sizes,iVar7);
            this_00 = arrayType.arraySizes;
            if (uVar8 == 0) {
              plVar10 = (long *)(**(code **)(*plVar9 + 0xf0))();
              this_01 = (TSmallArrayVector *)(**(code **)(*plVar10 + 0x98))(plVar10);
              uVar8 = TSmallArrayVector::getDimSize(this_01,iVar7 + -1);
              TSmallArrayVector::setDimSize(&this_00->sizes,iVar7,uVar8);
            }
            iVar7 = iVar7 + 1;
          }
        }
      }
    }
    iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x32])(node);
    uVar8 = TSmallArrayVector::frontSize(&(arrayType.arraySizes)->sizes);
    lengthenList(this,loc,(TIntermSequence *)CONCAT44(extraout_var_23,iVar7),uVar8,scalarInit);
    TType::TType(&elementType,&arrayType,0,false);
    lVar12 = 0;
    while (uVar8 = TSmallArrayVector::frontSize(&(arrayType.arraySizes)->sizes), lVar12 < (int)uVar8
          ) {
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      pTVar13 = (TIntermTyped *)
                (**(code **)(**(long **)(*(long *)(CONCAT44(extraout_var_24,iVar7) + 8) + lVar12 * 8
                                        ) + 0x18))();
      pTVar13 = convertInitializerList(this,loc,&elementType,pTVar13,scalarInit);
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      *(TIntermTyped **)(*(long *)(CONCAT44(extraout_var_25,iVar7) + 8) + lVar12 * 8) = pTVar13;
      iVar7 = (*(node->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x32])(node);
      lVar1 = lVar12 * 8;
      lVar12 = lVar12 + 1;
      if (*(long *)(*(long *)(CONCAT44(extraout_var_26,iVar7) + 8) + lVar1) == 0) {
        return (TIntermTyped *)0x0;
      }
    }
    type = &arrayType;
  }
  pTVar13 = addConstructor(this,loc,(TIntermTyped *)node,type);
  return pTVar13;
}

Assistant:

TIntermTyped* HlslParseContext::convertInitializerList(const TSourceLoc& loc, const TType& type,
                                                       TIntermTyped* initializer, TIntermTyped* scalarInit)
{
    // Will operate recursively.  Once a subtree is found that is constructor style,
    // everything below it is already good: Only the "top part" of the initializer
    // can be an initializer list, where "top part" can extend for several (or all) levels.

    // see if we have bottomed out in the tree within the initializer-list part
    TIntermAggregate* initList = initializer->getAsAggregate();
    if (initList == nullptr || initList->getOp() != EOpNull) {
        // We don't have a list, but if it's a scalar and the 'type' is a
        // composite, we need to lengthen below to make it useful.
        // Otherwise, this is an already formed object to initialize with.
        if (type.isScalar() || !initializer->getType().isScalar())
            return initializer;
        else
            initList = intermediate.makeAggregate(initializer);
    }

    // Of the initializer-list set of nodes, need to process bottom up,
    // so recurse deep, then process on the way up.

    // Go down the tree here...
    if (type.isArray()) {
        // The type's array might be unsized, which could be okay, so base sizes on the size of the aggregate.
        // Later on, initializer execution code will deal with array size logic.
        TType arrayType;
        arrayType.shallowCopy(type);                     // sharing struct stuff is fine
        arrayType.copyArraySizes(*type.getArraySizes()); // but get a fresh copy of the array information, to edit below

        // edit array sizes to fill in unsized dimensions
        if (type.isUnsizedArray())
            arrayType.changeOuterArraySize((int)initList->getSequence().size());

        // set unsized array dimensions that can be derived from the initializer's first element
        if (arrayType.isArrayOfArrays() && initList->getSequence().size() > 0) {
            TIntermTyped* firstInit = initList->getSequence()[0]->getAsTyped();
            if (firstInit->getType().isArray() &&
                arrayType.getArraySizes()->getNumDims() == firstInit->getType().getArraySizes()->getNumDims() + 1) {
                for (int d = 1; d < arrayType.getArraySizes()->getNumDims(); ++d) {
                    if (arrayType.getArraySizes()->getDimSize(d) == UnsizedArraySize)
                        arrayType.getArraySizes()->setDimSize(d, firstInit->getType().getArraySizes()->getDimSize(d - 1));
                }
            }
        }

        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), arrayType.getOuterArraySize(), scalarInit);

        // recursively process each element
        TType elementType(arrayType, 0); // dereferenced type
        for (int i = 0; i < arrayType.getOuterArraySize(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, elementType,
                                                                initList->getSequence()[i]->getAsTyped(), scalarInit);
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }

        return addConstructor(loc, initList, arrayType);
    } else if (type.isStruct()) {
        // do we have implicit assignments to opaques?
        for (size_t i = initList->getSequence().size(); i < type.getStruct()->size(); ++i) {
            if ((*type.getStruct())[i].type->containsOpaque()) {
                error(loc, "cannot implicitly initialize opaque members", "initializer list", "");
                return nullptr;
            }
        }

        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), static_cast<int>(type.getStruct()->size()), scalarInit);

        if (type.getStruct()->size() != initList->getSequence().size()) {
            error(loc, "wrong number of structure members", "initializer list", "");
            return nullptr;
        }
        for (size_t i = 0; i < type.getStruct()->size(); ++i) {
            initList->getSequence()[i] = convertInitializerList(loc, *(*type.getStruct())[i].type,
                                                                initList->getSequence()[i]->getAsTyped(), scalarInit);
            if (initList->getSequence()[i] == nullptr)
                return nullptr;
        }
    } else if (type.isMatrix()) {
        if (type.computeNumComponents() == (int)initList->getSequence().size()) {
            // This means the matrix is initialized component-wise, rather than as
            // a series of rows and columns.  We can just use the list directly as
            // a constructor; no further processing needed.
        } else {
            // lengthen list to be long enough
            lengthenList(loc, initList->getSequence(), type.getMatrixCols(), scalarInit);

            if (type.getMatrixCols() != (int)initList->getSequence().size()) {
                error(loc, "wrong number of matrix columns:", "initializer list", type.getCompleteString().c_str());
                return nullptr;
            }
            TType vectorType(type, 0); // dereferenced type
            for (int i = 0; i < type.getMatrixCols(); ++i) {
                initList->getSequence()[i] = convertInitializerList(loc, vectorType,
                                                                    initList->getSequence()[i]->getAsTyped(), scalarInit);
                if (initList->getSequence()[i] == nullptr)
                    return nullptr;
            }
        }
    } else if (type.isVector()) {
        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), type.getVectorSize(), scalarInit);

        // error check; we're at bottom, so work is finished below
        if (type.getVectorSize() != (int)initList->getSequence().size()) {
            error(loc, "wrong vector size (or rows in a matrix column):", "initializer list",
                  type.getCompleteString().c_str());
            return nullptr;
        }
    } else if (type.isScalar()) {
        // lengthen list to be long enough
        lengthenList(loc, initList->getSequence(), 1, scalarInit);

        if ((int)initList->getSequence().size() != 1) {
            error(loc, "scalar expected one element:", "initializer list", type.getCompleteString().c_str());
            return nullptr;
        }
    } else {
        error(loc, "unexpected initializer-list type:", "initializer list", type.getCompleteString().c_str());
        return nullptr;
    }

    // Now that the subtree is processed, process this node as if the
    // initializer list is a set of arguments to a constructor.
    TIntermTyped* emulatedConstructorArguments;
    if (initList->getSequence().size() == 1)
        emulatedConstructorArguments = initList->getSequence()[0]->getAsTyped();
    else
        emulatedConstructorArguments = initList;

    return addConstructor(loc, emulatedConstructorArguments, type);
}